

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzline.cpp
# Opt level: O0

TPZTransform<double> * pztopology::TPZLine::TransformSideToElement(int side)

{
  TPZFMatrix<double> *pTVar1;
  TPZTransform<double> *pTVar2;
  double *pdVar3;
  int in_ESI;
  TPZTransform<double> *in_RDI;
  TPZTransform<double> t;
  int sidedim;
  int64_t in_stack_fffffffffffffdf0;
  TPZTransform<double> *in_stack_fffffffffffffdf8;
  TPZTransform<double> *in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe18;
  TPZTransform<double> *in_stack_fffffffffffffe20;
  TPZTransform<double> local_1b0;
  uint local_10;
  int local_c;
  
  if ((in_ESI < 0) || (2 < in_ESI)) {
    std::operator<<((ostream *)&std::cerr,"TPZLine::TransformSideToElement side out range\n");
    TPZTransform<double>::TPZTransform
              (in_stack_fffffffffffffe20,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
               (int)in_stack_fffffffffffffe18);
  }
  else {
    local_10 = (uint)(1 < in_ESI);
    pTVar2 = &local_1b0;
    local_c = in_ESI;
    TPZTransform<double>::TPZTransform
              (pTVar2,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20),(int)in_stack_fffffffffffffe18
              );
    pTVar1 = TPZTransform<double>::Mult(pTVar2);
    (*(pTVar1->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              ();
    pTVar1 = TPZTransform<double>::Sum(&local_1b0);
    (*(pTVar1->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              ();
    if (local_c == 0) {
      TPZTransform<double>::Sum(&local_1b0);
      pTVar2 = (TPZTransform<double> *)
               TPZFMatrix<double>::operator()
                         ((TPZFMatrix<double> *)in_stack_fffffffffffffe00,
                          (int64_t)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
      (pTVar2->super_TPZSavable)._vptr_TPZSavable = (_func_int **)0xbff0000000000000;
      TPZTransform<double>::TPZTransform(pTVar2,in_stack_fffffffffffffdf8);
    }
    else if (local_c == 1) {
      pTVar2 = (TPZTransform<double> *)TPZTransform<double>::Sum(&local_1b0);
      pdVar3 = TPZFMatrix<double>::operator()
                         ((TPZFMatrix<double> *)in_stack_fffffffffffffe00,(int64_t)pTVar2,
                          in_stack_fffffffffffffdf0);
      *pdVar3 = 1.0;
      TPZTransform<double>::TPZTransform(in_stack_fffffffffffffe00,pTVar2);
    }
    else if (local_c == 2) {
      TPZTransform<double>::Mult(&local_1b0);
      pdVar3 = TPZFMatrix<double>::operator()
                         ((TPZFMatrix<double> *)in_stack_fffffffffffffe00,
                          (int64_t)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
      *pdVar3 = 1.0;
      TPZTransform<double>::TPZTransform(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    }
    else {
      TPZTransform<double>::TPZTransform(pTVar2,(int)((ulong)pTVar1 >> 0x20),(int)pTVar1);
    }
    TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x150d890);
  }
  return in_RDI;
}

Assistant:

TPZTransform<> TPZLine::TransformSideToElement(int side){
		
		if(side<0 || side>2){
			PZError << "TPZLine::TransformSideToElement side out range\n";
			return TPZTransform<>(0,0);
		}
		int sidedim = 1;
		if(side <2) sidedim = 0;
		
		TPZTransform<> t(1,sidedim);
		t.Mult().Zero();
		t.Sum().Zero();
		
		switch(side){
			case 0:
				t.Sum()(0,0) = -1.0;
				return t;
			case 1:
				t.Sum()(0,0) =  1.0;
				return t;
			case 2:
				t.Mult()(0,0) =  1.0;
				return t;
		}
		return TPZTransform<>(0,0);
	}